

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall
BackwardPass::TransferCompoundedAddSubUsesToSrcs(BackwardPass *this,Instr *instr,int addSubUses)

{
  Opnd *pOVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOLEAN BVar5;
  int iVar6;
  undefined4 *puVar7;
  StackSym *stackSym;
  char *message;
  char *error;
  uint lineNumber;
  Opnd *opnd;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1d1e,"(instr)","instr");
    if (!bVar3) goto LAB_003e8bbf;
    *puVar7 = 0;
  }
  if (addSubUses < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    error = "(addSubUses >= 0)";
    message = "addSubUses >= 0";
    lineNumber = 0x1d1f;
  }
  else {
    if ((uint)addSubUses < 0x16) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      goto LAB_003e8ab0;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    error = "(addSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow)";
    message = "addSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow";
    lineNumber = 0x1d20;
  }
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                     ,lineNumber,error,message);
  if (!bVar3) {
LAB_003e8bbf:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar7 = 0;
LAB_003e8ab0:
  pOVar1 = instr->m_src2;
  opnd = instr->m_src1;
  bVar3 = true;
  do {
    if (opnd == (Opnd *)0x0) {
      return;
    }
    stackSym = IR::RegOpnd::TryGetStackSym(opnd);
    if (stackSym != (StackSym *)0x0) {
      iVar6 = *(int *)&stackSym->scratch;
      if (iVar6 < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1d2d,"(srcSym->scratch.globOpt.numCompoundedAddSubUses >= 0)",
                           "srcSym->scratch.globOpt.numCompoundedAddSubUses >= 0");
        if (!bVar4) goto LAB_003e8bbf;
        *puVar7 = 0;
        iVar6 = (stackSym->scratch).globOpt.numCompoundedAddSubUses;
      }
      if (0x15 < iVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1d2e,
                           "(srcSym->scratch.globOpt.numCompoundedAddSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow)"
                           ,
                           "srcSym->scratch.globOpt.numCompoundedAddSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow"
                          );
        if (!bVar4) goto LAB_003e8bbf;
        *puVar7 = 0;
      }
      bVar4 = SetIntOverflowDoesNotMatterInRangeIfLastUse(this,stackSym,addSubUses);
      if ((!bVar4) &&
         (BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                            (this->intOverflowDoesNotMatterInRangeBySymId,(stackSym->super_Sym).m_id
                            ), BVar5 != '\0')) {
        iVar6 = (stackSym->scratch).globOpt.numCompoundedAddSubUses;
        if (iVar6 <= addSubUses) {
          iVar6 = addSubUses;
        }
        (stackSym->scratch).globOpt.numCompoundedAddSubUses = iVar6;
      }
    }
    bVar4 = !bVar3;
    opnd = pOVar1;
    bVar3 = false;
    if (bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void
BackwardPass::TransferCompoundedAddSubUsesToSrcs(IR::Instr *const instr, const int addSubUses)
{
    Assert(instr);
    Assert(addSubUses >= 0);
    Assert(addSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow);

    IR::Opnd *const srcs[] = { instr->GetSrc1(), instr->GetSrc2() };
    for(int i = 0; i < _countof(srcs) && srcs[i]; ++i)
    {
        StackSym *const srcSym = IR::RegOpnd::TryGetStackSym(srcs[i]);
        if(!srcSym)
        {
            // Int overflow tracking is only done for StackSyms in RegOpnds. Int overflow matters for the src, so it is
            // guaranteed to be in the int range at this point if the instruction is int-specialized.
            continue;
        }

        Assert(srcSym->scratch.globOpt.numCompoundedAddSubUses >= 0);
        Assert(srcSym->scratch.globOpt.numCompoundedAddSubUses <= MaxCompoundedUsesInAddSubForIgnoringIntOverflow);

        if(SetIntOverflowDoesNotMatterInRangeIfLastUse(srcSym, addSubUses))
        {
            // This is the last use of the src
            continue;
        }

        if(intOverflowDoesNotMatterInRangeBySymId->Test(srcSym->m_id))
        {
            // Since a src may be compounded through different chains of add/sub instructions, the greater number must be
            // preserved
            srcSym->scratch.globOpt.numCompoundedAddSubUses =
                max(srcSym->scratch.globOpt.numCompoundedAddSubUses, addSubUses);
        }
        else
        {
            // Int overflow matters for the src, so it is guaranteed to be in the int range at this point if the instruction is
            // int-specialized
        }
    }
}